

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O3

void nmq_start(NMQ *q)

{
  uint uVar1;
  uint32_t uVar2;
  dlnode **ppdVar3;
  uint32_t *puVar4;
  dlnode *node;
  uint8_t uVar5;
  
  if (q->inited != '\0') {
    return;
  }
  q->inited = '\x01';
  if (q->steady_on == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint32_t)
            (long)((double)q->MTU *
                  ((double)((uint)q->flush_interval * q->MAX_SND_BUF_NUM) / 1000.0));
  }
  q->BYTES_PER_FLUSH = uVar2;
  ppdVar3 = (dlnode **)calloc(1,(ulong)q->MAX_SND_BUF_NUM << 3);
  if (ppdVar3 != (dlnode **)0x0) {
    q->snd_sn_to_node = ppdVar3;
    ppdVar3 = (dlnode **)calloc(1,(ulong)q->MAX_RCV_BUF_NUM << 3);
    if (ppdVar3 != (dlnode **)0x0) {
      q->rcv_sn_to_node = ppdVar3;
      puVar4 = (uint32_t *)calloc(1,(ulong)q->ackmaxnum << 3);
      if (puVar4 != (uint32_t *)0x0) {
        q->acklist = puVar4;
        uVar1 = q->MSS;
        uVar5 = (q->pool).CAP;
        dlist_init(&(q->pool).seg_list);
        (q->pool).left = uVar5;
        (q->pool).CAP = uVar5;
        (q->pool).MTU = uVar1;
        if (uVar5 == '\0') {
          return;
        }
        while (node = (dlnode *)malloc((ulong)uVar1 + 0x40), node != (dlnode *)0x0) {
          node[3].prev = (dlist_s *)0x0;
          node[3].next = (dlist_s *)0x0;
          node[2].prev = (dlist_s *)0x0;
          node[2].next = (dlist_s *)0x0;
          node[1].prev = (dlist_s *)0x0;
          node[1].next = (dlist_s *)0x0;
          node->prev = (dlist_s *)0x0;
          node->next = (dlist_s *)0x0;
          dlist_add_tail(&(q->pool).seg_list,node);
          uVar5 = uVar5 + 0xff;
          if (uVar5 == '\0') {
            return;
          }
        }
      }
    }
  }
  abort();
}

Assistant:

void nmq_start(NMQ *q) {
    if (!q->inited) {
        q->inited = 1;
        init_steady_state(q);
        allocate_mem(q);
    }
}